

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZmqReqRep.cpp
# Opt level: O0

shared_ptr<std::vector<char,_std::allocator<char>_>_> __thiscall
adios2::zmq::ZmqReqRep::Request(ZmqReqRep *this,char *request,size_t size,string *address)

{
  vector<char,_std::allocator<char>_> *pvVar1;
  undefined8 uVar2;
  rep rVar3;
  char *pcVar4;
  size_type sVar5;
  char *__src;
  undefined8 in_RCX;
  undefined8 in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  int *in_RSI;
  element_type *in_RDI;
  shared_ptr<std::vector<char,_std::allocator<char>_>_> sVar7;
  __enable_if_is_duration<std::chrono::duration<long>_> duration_2;
  time_point now_time_2;
  __enable_if_is_duration<std::chrono::duration<long>_> duration_1;
  time_point now_time_1;
  __enable_if_is_duration<std::chrono::duration<long>_> duration;
  time_point now_time;
  time_point start_time;
  int ret;
  void *socket;
  shared_ptr<std::vector<char,_std::allocator<char>_>_> *reply;
  duration<long,_std::ratio<1L,_1000000000L>_> *in_stack_fffffffffffffea8;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_fffffffffffffeb0;
  __enable_if_is_duration<std::chrono::duration<long>_> in_stack_fffffffffffffeb8;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffec8;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffed0;
  duration<long,_std::ratio<1L,_1L>_> local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  rep local_90;
  duration<long,_std::ratio<1L,_1L>_> local_88;
  undefined8 local_80;
  undefined8 local_78;
  rep local_68;
  duration<long,_std::ratio<1L,_1L>_> local_60;
  undefined8 local_58;
  undefined8 local_50;
  int local_48;
  vector<char,_std::allocator<char>_> *local_38;
  undefined1 local_29;
  undefined8 local_20;
  undefined8 local_18;
  
  local_29 = 0;
  local_20 = in_RCX;
  local_18 = in_RDX;
  sVar7 = std::make_shared<std::vector<char,std::allocator<char>>>();
  local_38 = (vector<char,_std::allocator<char>_> *)
             zmq_socket(*(undefined8 *)(in_RSI + 8),3,
                        sVar7.
                        super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi._M_pi);
  local_48 = 1;
  local_50 = std::chrono::_V2::system_clock::now();
  do {
    pvVar1 = local_38;
    if (local_48 == 0) {
      local_48 = -1;
      local_78 = std::chrono::_V2::system_clock::now();
      local_50 = local_78;
      goto LAB_00dbaa60;
    }
    uVar2 = std::__cxx11::string::c_str();
    local_48 = zmq_connect(pvVar1,uVar2);
    zmq_setsockopt(local_38,0x1c,in_RSI,4);
    zmq_setsockopt(local_38,0x1b,in_RSI,4);
    zmq_setsockopt(local_38,0x11,in_RSI,4);
    local_58 = std::chrono::_V2::system_clock::now();
    local_68 = (rep)std::chrono::operator-(in_stack_fffffffffffffeb8.__r,in_stack_fffffffffffffeb0);
    local_60.__r = (rep)std::chrono::
                        duration_cast<std::chrono::duration<long,std::ratio<1l,1l>>,long,std::ratio<1l,1000000000l>>
                                  (in_stack_fffffffffffffea8);
    rVar3 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_60);
  } while (rVar3 <= *in_RSI);
  zmq_close(local_38);
  _Var6._M_pi = extraout_RDX;
  goto LAB_00dbad02;
  while( true ) {
    local_48 = zmq_send(local_38,local_18,local_20,0);
    local_80 = std::chrono::_V2::system_clock::now();
    local_90 = (rep)std::chrono::operator-(in_stack_fffffffffffffeb8.__r,in_stack_fffffffffffffeb0);
    local_88.__r = (rep)std::chrono::
                        duration_cast<std::chrono::duration<long,std::ratio<1l,1l>>,long,std::ratio<1l,1000000000l>>
                                  (in_stack_fffffffffffffea8);
    rVar3 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_88);
    if (*in_RSI < rVar3) break;
LAB_00dbaa60:
    if (0 < local_48) {
      local_48 = -1;
      local_98 = std::chrono::_V2::system_clock::now();
      local_50 = local_98;
      goto LAB_00dbab72;
    }
  }
  zmq_close(local_38);
  _Var6._M_pi = extraout_RDX_00;
  goto LAB_00dbad02;
  while( true ) {
    in_stack_fffffffffffffec8 = (vector<char,_std::allocator<char>_> *)(in_RSI + 2);
    in_stack_fffffffffffffed0 = local_38;
    pcVar4 = std::vector<char,_std::allocator<char>_>::data
                       ((vector<char,_std::allocator<char>_> *)0xdbaba3);
    sVar5 = std::vector<char,_std::allocator<char>_>::capacity(in_stack_fffffffffffffec8);
    local_48 = zmq_recv(in_stack_fffffffffffffed0,pcVar4,sVar5,0);
    local_a0 = std::chrono::_V2::system_clock::now();
    std::chrono::operator-
              ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)in_stack_fffffffffffffeb8.__r,in_stack_fffffffffffffeb0);
    in_stack_fffffffffffffeb8 =
         std::chrono::
         duration_cast<std::chrono::duration<long,std::ratio<1l,1l>>,long,std::ratio<1l,1000000000l>>
                   (in_stack_fffffffffffffea8);
    local_a8.__r = in_stack_fffffffffffffeb8.__r;
    in_stack_fffffffffffffeb0 =
         (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
          *)std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_a8);
    if ((long)*in_RSI < (long)in_stack_fffffffffffffeb0) break;
LAB_00dbab72:
    if (0 < local_48) {
      std::
      __shared_ptr_access<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0xdbac90);
      std::vector<char,_std::allocator<char>_>::resize
                (in_stack_fffffffffffffed0,(size_type)in_stack_fffffffffffffec8);
      std::
      __shared_ptr_access<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0xdbacaf);
      pcVar4 = std::vector<char,_std::allocator<char>_>::data
                         ((vector<char,_std::allocator<char>_> *)0xdbacb7);
      __src = std::vector<char,_std::allocator<char>_>::data
                        ((vector<char,_std::allocator<char>_> *)0xdbaccc);
      memcpy(pcVar4,__src,(long)local_48);
      zmq_close(local_38);
      _Var6._M_pi = extraout_RDX_02;
      goto LAB_00dbad02;
    }
  }
  zmq_close(local_38);
  _Var6._M_pi = extraout_RDX_01;
LAB_00dbad02:
  sVar7.super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var6._M_pi;
  sVar7.super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = in_RDI;
  return (shared_ptr<std::vector<char,_std::allocator<char>_>_>)
         sVar7.
         super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<std::vector<char>> ZmqReqRep::Request(const char *request, const size_t size,
                                                      const std::string &address)
{
    auto reply = std::make_shared<std::vector<char>>();
    void *socket = zmq_socket(m_Context, ZMQ_REQ);

    int ret = 1;
    auto start_time = std::chrono::system_clock::now();
    while (ret)
    {
        ret = zmq_connect(socket, address.c_str());
        zmq_setsockopt(socket, ZMQ_SNDTIMEO, &m_Timeout, sizeof(m_Timeout));
        zmq_setsockopt(socket, ZMQ_RCVTIMEO, &m_Timeout, sizeof(m_Timeout));
        zmq_setsockopt(socket, ZMQ_LINGER, &m_Timeout, sizeof(m_Timeout));

        auto now_time = std::chrono::system_clock::now();
        auto duration = std::chrono::duration_cast<std::chrono::seconds>(now_time - start_time);
        if (duration.count() > m_Timeout)
        {
            zmq_close(socket);
            return reply;
        }
    }

    ret = -1;
    start_time = std::chrono::system_clock::now();
    while (ret < 1)
    {
        ret = zmq_send(socket, request, size, 0);
        auto now_time = std::chrono::system_clock::now();
        auto duration = std::chrono::duration_cast<std::chrono::seconds>(now_time - start_time);
        if (duration.count() > m_Timeout)
        {
            zmq_close(socket);
            return reply;
        }
    }

    ret = -1;
    start_time = std::chrono::system_clock::now();
    while (ret < 1)
    {
        ret = zmq_recv(socket, m_ReceiverBuffer.data(), m_ReceiverBuffer.capacity(), 0);
        auto now_time = std::chrono::system_clock::now();
        auto duration = std::chrono::duration_cast<std::chrono::seconds>(now_time - start_time);
        if (duration.count() > m_Timeout)
        {
            zmq_close(socket);
            return reply;
        }
    }

    reply->resize(ret);
    std::memcpy(reply->data(), m_ReceiverBuffer.data(), ret);
    zmq_close(socket);
    return reply;
}